

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void timer_cb(uv_timer_t *handle)

{
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-walk-handles.c"
          ,0x2d,"handle","==","&timer",handle,"==",&timer);
  abort();
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  int r;

  r = uv_fs_event_init(handle->loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_fail, ".", 0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&fs_event, close_cb);
  uv_close((uv_handle_t*)handle, close_cb);
}